

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O0

void __thiscall
Diligent::QueryBase<Diligent::EngineGLImplTraits>::~QueryBase
          (QueryBase<Diligent::EngineGLImplTraits> *this)

{
  undefined *puVar1;
  undefined8 uVar2;
  char (*in_R8) [64];
  undefined1 local_30 [8];
  string _msg;
  QueryBase<Diligent::EngineGLImplTraits> *this_local;
  
  (this->
  super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>).
  super_ObjectBase<Diligent::IQueryGL>.super_RefCountedObject<Diligent::IQueryGL>.super_IQueryGL.
  super_IQuery.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_013a8630;
  _msg.field_2._8_8_ = this;
  if (this->m_State == Querying) {
    FormatString<char[19],char_const*,char[64]>
              ((string *)local_30,(Diligent *)"Destroying query \'",
               (char (*) [19])
               &(this->
                super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                ).m_Desc,(char **)"\' that is in querying state. End the query before releasing it."
               ,in_R8);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_30);
  }
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::~RefCntAutoPtr(&this->m_pContext);
  DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>::
  ~DeviceObjectBase(&this->
                     super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                   );
  return;
}

Assistant:

~QueryBase()
    {
        if (m_State == QueryState::Querying)
        {
            LOG_ERROR_MESSAGE("Destroying query '", this->m_Desc.Name,
                              "' that is in querying state. End the query before releasing it.");
        }
    }